

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O2

FT_Error pfr_slot_load(FT_GlyphSlot_conflict pfrslot,FT_Size pfrsize,FT_UInt gindex,
                      FT_Int32 load_flags)

{
  FT_Outline *outline;
  byte bVar1;
  FT_Face pFVar2;
  FT_Stream pFVar3;
  FT_Generic_Finalizer p_Var4;
  FT_Vector *pFVar5;
  ushort *puVar6;
  undefined8 uVar7;
  short *psVar8;
  FT_Error FVar9;
  int iVar10;
  FT_Error FVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  long lVar25;
  FT_Long a_;
  ushort uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  byte *pbVar31;
  byte *pbVar32;
  ushort *puVar33;
  ushort *puVar34;
  FT_Int phase;
  uint uVar35;
  long lVar36;
  uint *puVar37;
  ulong uVar38;
  bool bVar39;
  FT_ULong local_88;
  FT_BBox cbox;
  
  pFVar2 = pfrslot->face;
  uVar18 = gindex - 1;
  if (gindex == 0) {
    uVar18 = 0;
  }
  FVar9 = 6;
  if (pFVar2 == (FT_Face)0x0) {
    return 6;
  }
  if (*(uint *)&pFVar2[2].generic.data <= uVar18) {
    return 6;
  }
  if ((load_flags & 9U) == 0) {
    puVar24 = (uint *)((ulong)uVar18 * 0x10 + pFVar2[2].bbox.xMin);
    pFVar3 = pFVar2->stream;
    iVar10 = *(int *)&pFVar2[2].style_name;
    puVar37 = (uint *)(*(long *)&pFVar2[2].num_fixed_sizes + 0x1c);
    while (bVar39 = iVar10 != 0, iVar10 = iVar10 + -1, bVar39) {
      if ((puVar37[-7] == (uint)(pfrsize->metrics).x_ppem) &&
         (puVar37[-6] == (uint)(pfrsize->metrics).y_ppem)) {
        uVar30 = puVar37[-5];
        FVar11 = FT_Stream_Seek(pFVar3,(ulong)puVar37[-1] + *(long *)&pFVar2[2].units_per_EM);
        if (FVar11 == 0) {
          iVar10 = (uVar30 & 1) + 5;
          if ((uVar30 & 2) == 0) {
            iVar10 = (uVar30 & 1) + 4;
          }
          FVar11 = FT_Stream_EnterFrame
                             (pFVar3,(ulong)((iVar10 + (uint)((uVar30 >> 2 & 1) != 0)) * *puVar37));
          if (FVar11 == 0) {
            pbVar32 = pFVar3->cursor;
            uVar30 = puVar37[-5];
            uVar19 = *puVar37;
            uVar23 = *puVar24;
            uVar27 = uVar30 & 1;
            iVar10 = uVar27 + 5;
            if ((uVar30 & 2) == 0) {
              iVar10 = uVar27 + 4;
            }
            uVar29 = iVar10 + (uint)((uVar30 >> 2 & 1) != 0);
            if ((uVar30 & 0x40) != 0) goto LAB_001478d9;
            uVar12 = uVar30 | 0x80;
            pbVar31 = pFVar3->limit;
            puVar37[-5] = uVar12;
            if (pbVar32 + uVar29 * uVar19 <= pbVar31) {
              uVar15 = 0xffffffffffffffff;
              pbVar31 = pbVar32;
              goto LAB_0014788f;
            }
            uVar12 = uVar30 & 0xffffff3f;
            goto LAB_001478d1;
          }
        }
        break;
      }
      puVar37 = puVar37 + 10;
    }
  }
  goto LAB_001474c9;
LAB_0014788f:
  if (pbVar32 + uVar29 * uVar19 <= pbVar31) goto LAB_001478d1;
  uVar38 = (ulong)*pbVar31;
  if (uVar27 != 0) {
    uVar38 = (ulong)CONCAT11(*pbVar31,pbVar31[1]);
  }
  if ((long)uVar38 <= (long)uVar15) {
    uVar12 = uVar30 & 0xffffff3f;
    goto LAB_001478d1;
  }
  pbVar31 = pbVar31 + uVar29;
  uVar15 = uVar38;
  goto LAB_0014788f;
LAB_001478d1:
  uVar30 = uVar12 | 0x40;
  puVar37[-5] = uVar30;
LAB_001478d9:
  if ((char)uVar30 < '\0') {
    uVar12 = 0;
    do {
      if (uVar19 <= uVar12) goto LAB_001478de;
      uVar35 = uVar12 + uVar19 >> 1;
      uVar15 = (ulong)(uVar35 * uVar29);
      uVar13 = (uint)pbVar32[uVar15];
      if (uVar27 == 0) {
        lVar14 = uVar15 + 1;
      }
      else {
        lVar14 = uVar15 + 2;
        uVar13 = (uint)CONCAT11(pbVar32[uVar15],pbVar32[uVar15 + 1]);
      }
      pbVar31 = pbVar32 + lVar14;
      uVar22 = uVar35 + 1;
      if (uVar23 <= uVar13) {
        uVar22 = uVar12;
      }
      if (uVar13 <= uVar23) {
        uVar12 = uVar22;
        uVar35 = uVar19;
      }
      uVar19 = uVar35;
    } while (uVar13 != uVar23);
    local_88 = (FT_ULong)*pbVar31;
    if ((uVar30 & 2) == 0) {
      pbVar32 = pbVar31 + 1;
    }
    else {
      pbVar32 = pbVar31 + 2;
      local_88 = (FT_ULong)CONCAT11(*pbVar31,pbVar31[1]);
    }
    uVar15 = (ulong)pbVar32[1];
    if ((uVar30 & 4) == 0) {
      uVar38 = (ulong)*pbVar32 << 8;
    }
    else {
      uVar15 = (ulong)((uint)pbVar32[1] << 8 | (uint)*pbVar32 << 0x10);
      uVar38 = (ulong)pbVar32[2];
    }
    uVar38 = uVar38 | uVar15;
  }
  else {
LAB_001478de:
    local_88 = 0;
    uVar38 = 0;
  }
  FT_Stream_ExitFrame(pFVar3);
  if (local_88 == 0) goto LAB_001474c9;
  a_ = (FT_Long)(int)puVar24[1];
  uVar30 = *(uint *)((long)&pFVar2[1].driver + 4);
  lVar14 = a_;
  if (uVar30 != *(uint *)&pFVar2[1].driver) {
    a_ = FT_MulDiv(a_,(ulong)*(uint *)&pFVar2[1].driver,(ulong)uVar30);
    uVar30 = *(uint *)((long)&pFVar2[1].driver + 4);
    lVar14 = (long)(int)puVar24[1];
  }
  pfrslot->linearHoriAdvance = a_;
  FT_MulDiv((ulong)(pfrsize->metrics).x_ppem << 8,lVar14,(ulong)uVar30);
  FVar11 = FT_Stream_Seek(pFVar3,uVar38 + (uint)pFVar2[1].num_fixed_sizes);
  if ((FVar11 != 0) || (FVar11 = FT_Stream_EnterFrame(pFVar3,local_88), FVar11 != 0))
  goto LAB_001474c9;
  pbVar32 = pFVar3->cursor;
  puVar6 = (ushort *)pFVar3->limit;
  if (puVar6 < pbVar32 + 1) goto LAB_00147a62;
  bVar1 = *pbVar32;
  switch(bVar1 & 3) {
  case 0:
    puVar33 = (ushort *)(pbVar32 + 2);
    if (puVar6 < puVar33) break;
    uVar15 = (long)((ulong)(byte)*(ushort *)(pbVar32 + 1) << 0x3c) >> 0x3c;
    bVar16 = bVar1 >> 2 & 3;
    uVar17 = (ushort)bVar16;
    uVar26 = (ushort)bVar16;
    puVar34 = puVar33;
    switch(bVar16) {
    case 1:
switchD_00147b89_caseD_1:
      puVar33 = (ushort *)((long)puVar34 + 1);
      if (puVar6 < puVar33) goto LAB_00147a62;
      uVar17 = (ushort)(byte)((byte)*puVar34 >> 4);
      uVar26 = (byte)*puVar34 & 0xf;
      bVar1 = bVar1 >> 4;
      uVar23 = (uint)bVar1;
      uVar30 = uVar23;
      uVar19 = (uint)bVar1;
      switch(bVar1 & 3) {
      case 0:
        goto switchD_00147c6e_caseD_0;
      case 1:
        goto switchD_00147c6e_caseD_1;
      case 3:
        goto switchD_00147c6e_caseD_3;
      }
      goto switchD_00147c6e_caseD_2;
    case 2:
switchD_00147b89_caseD_2:
      puVar33 = puVar34 + 1;
      if (puVar6 < puVar33) goto LAB_00147a62;
      uVar17 = (ushort)(byte)*puVar34;
      uVar26 = (ushort)*(byte *)((long)puVar34 + 1);
      bVar1 = bVar1 >> 4;
      uVar23 = (uint)bVar1;
      uVar30 = uVar23;
      uVar19 = (uint)bVar1;
      switch(bVar1 & 3) {
      case 0:
        goto switchD_00147c6e_caseD_0;
      case 2:
        goto switchD_00147c6e_caseD_2;
      case 3:
        goto switchD_00147c6e_caseD_3;
      }
      goto switchD_00147c6e_caseD_1;
    case 3:
switchD_00147b89_caseD_3:
      puVar33 = puVar34 + 2;
      if (puVar6 < puVar33) goto LAB_00147a62;
      uVar17 = *puVar34 << 8 | *puVar34 >> 8;
      uVar26 = puVar34[1] << 8 | puVar34[1] >> 8;
    }
switchD_00147b89_caseD_0:
    bVar1 = bVar1 >> 4;
    uVar23 = (uint)bVar1;
    uVar30 = (uint)bVar1;
    uVar19 = (uint)bVar1;
    switch(bVar1 & 3) {
    case 0:
switchD_00147c6e_caseD_0:
      FVar9 = (*(code *)(&DAT_001872b0 + *(int *)(&DAT_001872b0 + (ulong)(uVar30 >> 2) * 4)))();
      return FVar9;
    case 1:
switchD_00147c6e_caseD_1:
      if ((ushort *)((long)puVar33 + 1U) <= puVar6) {
        FVar9 = (*(code *)(&DAT_001872b0 + *(int *)(&DAT_001872b0 + (ulong)(uVar23 >> 2) * 4)))();
        return FVar9;
      }
      break;
    case 2:
switchD_00147c6e_caseD_2:
      if (puVar33 + 1 <= puVar6) {
        FVar9 = (*(code *)(&DAT_001872b0 + *(int *)(&DAT_001872b0 + (ulong)(uVar23 >> 2) * 4)))
                          (uVar26,&DAT_001872b0,uVar17,uVar15,
                           &DAT_001872b0 + *(int *)(&DAT_001872b0 + (ulong)(uVar23 >> 2) * 4));
        return FVar9;
      }
      break;
    case 3:
switchD_00147c6e_caseD_3:
      uVar30 = uVar19;
      if ((ushort *)((long)puVar33 + 3U) <= puVar6) goto switchD_00147c6e_caseD_0;
    }
    break;
  case 1:
    puVar33 = (ushort *)(pbVar32 + 3);
    if (puVar33 <= puVar6) {
      uVar15 = (ulong)(char)pbVar32[2];
      bVar16 = bVar1 >> 2 & 3;
      uVar17 = (ushort)bVar16;
      uVar26 = (ushort)bVar16;
      puVar34 = puVar33;
      switch(bVar16) {
      case 1:
        goto switchD_00147b89_caseD_1;
      case 2:
        goto switchD_00147b89_caseD_2;
      case 3:
        goto switchD_00147b89_caseD_3;
      }
      goto switchD_00147b89_caseD_0;
    }
    break;
  case 2:
    puVar33 = (ushort *)(pbVar32 + 5);
    if (puVar33 <= puVar6) {
      uVar15 = (long)(short)((ushort)pbVar32[3] << 8) | (ulong)pbVar32[4];
      bVar16 = bVar1 >> 2 & 3;
      uVar17 = (ushort)bVar16;
      uVar26 = (ushort)bVar16;
      puVar34 = puVar33;
      switch(bVar16) {
      case 1:
        goto switchD_00147b89_caseD_1;
      case 2:
        goto switchD_00147b89_caseD_2;
      case 3:
        goto switchD_00147b89_caseD_3;
      }
      goto switchD_00147b89_caseD_0;
    }
    break;
  case 3:
    puVar33 = (ushort *)(pbVar32 + 7);
    if (puVar33 <= puVar6) {
      uVar15 = (ulong)pbVar32[6] | (ulong)((uint)pbVar32[5] << 8 | (uint)pbVar32[4] << 0x10);
      bVar16 = bVar1 >> 2 & 3;
      uVar17 = (ushort)bVar16;
      uVar26 = (ushort)bVar16;
      puVar34 = puVar33;
      switch(bVar16) {
      case 1:
        goto switchD_00147b89_caseD_1;
      case 2:
        goto switchD_00147b89_caseD_2;
      case 3:
        goto switchD_00147b89_caseD_3;
      }
      goto switchD_00147b89_caseD_0;
    }
  }
LAB_00147a62:
  FT_Stream_ExitFrame(pFVar3);
LAB_001474c9:
  if (((uint)load_flags >> 0xe & 1) == 0) {
    lVar14 = pFVar2[2].bbox.xMin;
    pfrslot->format = FT_GLYPH_FORMAT_OUTLINE;
    (pfrslot->outline).n_contours = 0;
    (pfrslot->outline).n_points = 0;
    lVar20 = (ulong)uVar18 * 0x10;
    uVar18 = pFVar2[1].num_fixed_sizes;
    pFVar3 = pFVar2->stream;
    uVar30 = *(uint *)(lVar14 + 8 + lVar20);
    uVar19 = *(uint *)(lVar14 + 0xc + lVar20);
    FT_GlyphLoader_Rewind((FT_GlyphLoader)pfrslot[1].generic.finalizer);
    pfrslot[1].reserved = 0;
    FVar9 = pfr_glyph_load_rec((PFR_Glyph)(pfrslot + 1),pFVar3,(ulong)uVar18,(ulong)uVar19,
                               (ulong)uVar30);
    if (FVar9 == 0) {
      outline = &pfrslot->outline;
      p_Var4 = pfrslot[1].generic.finalizer;
      *(undefined8 *)&(pfrslot->outline).flags = *(undefined8 *)(p_Var4 + 0x38);
      uVar7 = *(undefined8 *)(p_Var4 + 0x18);
      pFVar5 = *(FT_Vector **)(p_Var4 + 0x20);
      psVar8 = *(short **)(p_Var4 + 0x30);
      (pfrslot->outline).tags = *(char **)(p_Var4 + 0x28);
      (pfrslot->outline).contours = psVar8;
      outline->n_contours = (short)uVar7;
      outline->n_points = (short)((ulong)uVar7 >> 0x10);
      *(int *)&outline->field_0x4 = (int)((ulong)uVar7 >> 0x20);
      (pfrslot->outline).points = pFVar5;
      uVar18 = (pfrslot->outline).flags & 0xfffffffa;
      (pfrslot->outline).flags = uVar18 + 4;
      if ((pfrsize != (FT_Size)0x0) && ((pfrsize->metrics).y_ppem < 0x18)) {
        (pfrslot->outline).flags = uVar18 | 0x104;
      }
      (pfrslot->metrics).horiAdvance = 0;
      (pfrslot->metrics).vertAdvance = 0;
      lVar14 = (long)*(int *)(lVar14 + lVar20 + 4);
      uVar18 = *(uint *)((long)&pFVar2[1].driver + 4);
      if (uVar18 != *(uint *)&pFVar2[1].driver) {
        lVar14 = FT_MulDiv(lVar14,(ulong)*(uint *)&pFVar2[1].driver,(ulong)uVar18);
      }
      if (((ulong)pFVar2[1].autohint.data & 1) == 0) {
        (pfrslot->metrics).horiAdvance = lVar14;
        lVar20 = lVar14;
        lVar14 = (pfrslot->metrics).vertAdvance;
      }
      else {
        (pfrslot->metrics).vertAdvance = lVar14;
        lVar20 = (pfrslot->metrics).horiAdvance;
      }
      pfrslot->linearHoriAdvance = lVar20;
      pfrslot->linearVertAdvance = lVar14;
      (pfrslot->metrics).vertBearingX = 0;
      (pfrslot->metrics).vertBearingY = 0;
      if ((load_flags & 1U) == 0) {
        lVar25 = (long)(int)(pfrsize->metrics).x_scale;
        lVar21 = (long)(int)(pfrsize->metrics).y_scale;
        uVar17 = (pfrslot->outline).n_points;
        lVar28 = 0;
        if ((short)uVar17 < 1) {
          uVar17 = 0;
        }
        pFVar5 = (pfrslot->outline).points;
        for (; (uint)uVar17 << 4 != (int)lVar28; lVar28 = lVar28 + 0x10) {
          lVar36 = *(int *)((long)&pFVar5->x + lVar28) * lVar25;
          *(long *)((long)&pFVar5->x + lVar28) =
               (long)(int)((ulong)(lVar36 + 0x8000 + (lVar36 >> 0x3f)) >> 0x10);
          lVar36 = *(int *)((long)&pFVar5->y + lVar28) * lVar21;
          *(long *)((long)&pFVar5->y + lVar28) =
               (long)(int)((ulong)(lVar36 + 0x8000 + (lVar36 >> 0x3f)) >> 0x10);
        }
        lVar25 = lVar25 * (int)lVar20;
        (pfrslot->metrics).horiAdvance =
             (long)(int)((ulong)(lVar25 + 0x8000 + (lVar25 >> 0x3f)) >> 0x10);
        lVar21 = lVar21 * (int)lVar14;
        (pfrslot->metrics).vertAdvance =
             (long)(int)((ulong)(lVar21 + 0x8000 + (lVar21 >> 0x3f)) >> 0x10);
      }
      FT_Outline_Get_CBox(outline,&cbox);
      (pfrslot->metrics).width = cbox.xMax - cbox.xMin;
      (pfrslot->metrics).height = cbox.yMax - cbox.yMin;
      (pfrslot->metrics).horiBearingX = cbox.xMin;
      (pfrslot->metrics).horiBearingY = cbox.yMin;
      FVar9 = 0;
    }
  }
  return FVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_slot_load( FT_GlyphSlot  pfrslot,         /* PFR_Slot */
                 FT_Size       pfrsize,         /* PFR_Size */
                 FT_UInt       gindex,
                 FT_Int32      load_flags )
  {
    PFR_Slot     slot    = (PFR_Slot)pfrslot;
    PFR_Size     size    = (PFR_Size)pfrsize;
    FT_Error     error;
    PFR_Face     face    = (PFR_Face)pfrslot->face;
    PFR_Char     gchar;
    FT_Outline*  outline = &pfrslot->outline;
    FT_ULong     gps_offset;


    FT_TRACE1(( "pfr_slot_load: glyph index %d\n", gindex ));

    if ( gindex > 0 )
      gindex--;

    if ( !face || gindex >= face->phy_font.num_chars )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* try to load an embedded bitmap */
    if ( ( load_flags & ( FT_LOAD_NO_SCALE | FT_LOAD_NO_BITMAP ) ) == 0 )
    {
      error = pfr_slot_load_bitmap(
                slot,
                size,
                gindex,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      if ( !error )
        goto Exit;
    }

    if ( load_flags & FT_LOAD_SBITS_ONLY )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    gchar               = face->phy_font.chars + gindex;
    pfrslot->format     = FT_GLYPH_FORMAT_OUTLINE;
    outline->n_points   = 0;
    outline->n_contours = 0;
    gps_offset          = face->header.gps_section_offset;

    /* load the glyph outline (FT_LOAD_NO_RECURSE isn't supported) */
    error = pfr_glyph_load( &slot->glyph, face->root.stream,
                            gps_offset, gchar->gps_offset, gchar->gps_size );

    if ( !error )
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &pfrslot->metrics;
      FT_Pos             advance;
      FT_UInt            em_metrics, em_outline;
      FT_Bool            scaling;


      scaling = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE ) == 0 );

      /* copy outline data */
      *outline = slot->glyph.loader->base.outline;

      outline->flags &= ~FT_OUTLINE_OWNER;
      outline->flags |= FT_OUTLINE_REVERSE_FILL;

      if ( size && pfrsize->metrics.y_ppem < 24 )
        outline->flags |= FT_OUTLINE_HIGH_PRECISION;

      /* compute the advance vector */
      metrics->horiAdvance = 0;
      metrics->vertAdvance = 0;

      advance    = gchar->advance;
      em_metrics = face->phy_font.metrics_resolution;
      em_outline = face->phy_font.outline_resolution;

      if ( em_metrics != em_outline )
        advance = FT_MulDiv( advance,
                             (FT_Long)em_outline,
                             (FT_Long)em_metrics );

      if ( face->phy_font.flags & PFR_PHY_VERTICAL )
        metrics->vertAdvance = advance;
      else
        metrics->horiAdvance = advance;

      pfrslot->linearHoriAdvance = metrics->horiAdvance;
      pfrslot->linearVertAdvance = metrics->vertAdvance;

      /* make up vertical metrics(?) */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;

#if 0 /* some fonts seem to be broken here! */

      /* Apply the font matrix, if any.                 */
      /* TODO: Test existing fonts with unusual matrix  */
      /* whether we have to adjust Units per EM.        */
      {
        FT_Matrix font_matrix;


        font_matrix.xx = face->log_font.matrix[0] << 8;
        font_matrix.yx = face->log_font.matrix[1] << 8;
        font_matrix.xy = face->log_font.matrix[2] << 8;
        font_matrix.yy = face->log_font.matrix[3] << 8;

        FT_Outline_Transform( outline, &font_matrix );
      }
#endif

      /* scale when needed */
      if ( scaling )
      {
        FT_Int      n;
        FT_Fixed    x_scale = pfrsize->metrics.x_scale;
        FT_Fixed    y_scale = pfrsize->metrics.y_scale;
        FT_Vector*  vec     = outline->points;


        /* scale outline points */
        for ( n = 0; n < outline->n_points; n++, vec++ )
        {
          vec->x = FT_MulFix( vec->x, x_scale );
          vec->y = FT_MulFix( vec->y, y_scale );
        }

        /* scale the advance */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the rest of the metrics */
      FT_Outline_Get_CBox( outline, &cbox );

      metrics->width        = cbox.xMax - cbox.xMin;
      metrics->height       = cbox.yMax - cbox.yMin;
      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax - metrics->height;
    }

  Exit:
    return error;
  }